

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_message_builder_lite.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::java::MessageBuilderLiteGenerator::Generate
          (MessageBuilderLiteGenerator *this,Printer *printer)

{
  OneofDescriptor *oneof;
  long lVar1;
  long lVar2;
  __uniq_ptr_impl<google::protobuf::compiler::java::ImmutableFieldLiteGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>_>
  _Var3;
  char *buffer;
  mapped_type *pmVar4;
  _Base_ptr p_Var5;
  LogMessage *other;
  long *plVar6;
  Descriptor *pDVar7;
  Descriptor *descriptor;
  long lVar8;
  long lVar9;
  LogMessage local_e0;
  char *local_a8 [2];
  char local_98 [16];
  _Rb_tree_node_base *local_88;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  vars;
  key_type local_50;
  
  WriteMessageDocComment(printer,this->descriptor_);
  ClassNameResolver::GetClassName_abi_cxx11_
            ((string *)&local_e0,this->name_resolver_,this->descriptor_,true);
  ExtraBuilderInterfaces_abi_cxx11_((string *)&vars,(java *)this->descriptor_,descriptor);
  local_a8[0] = "";
  if (0 < *(int *)(this->descriptor_ + 0x78)) {
    local_a8[0] = "Extendable";
  }
  io::Printer::
  Print<char[10],std::__cxx11::string,char[17],std::__cxx11::string,char[11],char_const*>
            (printer,
             "public static final class Builder extends\n    com.google.protobuf.GeneratedMessageLite.$extendible$Builder<\n      $classname$, Builder> implements\n    $extra_interfaces$\n    $classname$OrBuilder {\n"
             ,(char (*) [10])0x3f42d2,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_e0,
             (char (*) [17])"extra_interfaces",
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vars,
             (char (*) [11])"extendible",local_a8);
  if ((_Base_ptr *)vars._M_t._M_impl._0_8_ !=
      &vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent) {
    operator_delete((void *)vars._M_t._M_impl._0_8_);
  }
  buffer = (char *)((long)&local_e0 + 0x10);
  if ((char *)local_e0._0_8_ != buffer) {
    operator_delete((void *)local_e0._0_8_);
  }
  io::Printer::Indent(printer);
  GenerateCommonBuilderMethods(this,printer);
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &vars._M_t._M_impl.super__Rb_tree_header._M_header;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  vars._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var5 = (this->oneofs_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_88 = &(this->oneofs_)._M_t._M_impl.super__Rb_tree_header._M_header;
  vars._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       vars._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  if (p_Var5 != local_88) {
    do {
      oneof = *(OneofDescriptor **)(p_Var5 + 1);
      Context::GetOneofGeneratorInfo(this->context_,oneof);
      local_e0._0_8_ = buffer;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,"oneof_name","");
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&vars,(key_type *)&local_e0);
      std::__cxx11::string::_M_assign((string *)pmVar4);
      if ((char *)local_e0._0_8_ != buffer) {
        operator_delete((void *)local_e0._0_8_);
      }
      Context::GetOneofGeneratorInfo(this->context_,oneof);
      local_e0._0_8_ = buffer;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_e0,"oneof_capitalized_name","");
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&vars,(key_type *)&local_e0);
      std::__cxx11::string::_M_assign((string *)pmVar4);
      if ((char *)local_e0._0_8_ != buffer) {
        operator_delete((void *)local_e0._0_8_);
      }
      local_e0._0_8_ = buffer;
      local_e0.filename_ =
           FastInt32ToBufferLeft
                     ((int)((ulong)((long)oneof - *(long *)(*(long *)(oneof + 0x10) + 0x30)) >> 3) *
                      -0x33333333,buffer);
      local_e0.filename_ = local_e0.filename_ + -(long)buffer;
      local_a8[0] = local_98;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_a8,local_e0._0_8_,local_e0.filename_ + local_e0._0_8_);
      local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_50,"oneof_index","");
      pmVar4 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[](&vars,&local_50);
      std::__cxx11::string::operator=((string *)pmVar4,(string *)local_a8);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      if (local_a8[0] != local_98) {
        operator_delete(local_a8[0]);
      }
      io::Printer::Print(printer,&vars,
                         "@java.lang.Override\npublic $oneof_capitalized_name$Case\n    get$oneof_capitalized_name$Case() {\n  return instance.get$oneof_capitalized_name$Case();\n}\n\npublic Builder clear$oneof_capitalized_name$() {\n  copyOnWrite();\n  instance.clear$oneof_capitalized_name$();\n  return this;\n}\n\n"
                        );
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5);
    } while (p_Var5 != local_88);
  }
  pDVar7 = this->descriptor_;
  if (0 < *(int *)(pDVar7 + 4)) {
    lVar8 = 0;
    lVar9 = 0;
    do {
      io::Printer::Print<>(printer,"\n");
      lVar1 = *(long *)(this->descriptor_ + 0x28);
      if (*(Descriptor **)(lVar1 + 0x20 + lVar8) != (this->field_generators_).descriptor_) {
        internal::LogMessage::LogMessage
                  (&local_e0,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/compiler/java/java_field.h"
                   ,0x8a);
        other = internal::LogMessage::operator<<
                          (&local_e0,"CHECK failed: (field->containing_type()) == (descriptor_): ");
        internal::LogFinisher::operator=((LogFinisher *)local_a8,other);
        internal::LogMessage::~LogMessage(&local_e0);
      }
      if ((*(byte *)(lVar1 + 1 + lVar8) & 8) == 0) {
        plVar6 = (long *)(*(long *)(lVar1 + 0x20 + lVar8) + 0x28);
      }
      else {
        lVar2 = *(long *)(lVar1 + 0x28 + lVar8);
        if (lVar2 == 0) {
          plVar6 = (long *)(*(long *)(lVar1 + 0x10 + lVar8) + 0x70);
        }
        else {
          plVar6 = (long *)(lVar2 + 0x50);
        }
      }
      _Var3._M_t.
      super__Tuple_impl<0UL,_google::protobuf::compiler::java::ImmutableFieldLiteGenerator_*,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>_>
      .super__Head_base<0UL,_google::protobuf::compiler::java::ImmutableFieldLiteGenerator_*,_false>
      ._M_head_impl =
           (this->field_generators_).field_generators_.
           super__Vector_base<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldLiteGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::java::ImmutableFieldLiteGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start
           [(int)((ulong)((lVar1 - *plVar6) + lVar8) >> 3) * 0x38e38e39]._M_t.
           super___uniq_ptr_impl<google::protobuf::compiler::java::ImmutableFieldLiteGenerator,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>_>
           ._M_t;
      (**(code **)(*(long *)_Var3._M_t.
                            super__Tuple_impl<0UL,_google::protobuf::compiler::java::ImmutableFieldLiteGenerator_*,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>_>
                            .
                            super__Head_base<0UL,_google::protobuf::compiler::java::ImmutableFieldLiteGenerator_*,_false>
                            ._M_head_impl + 0x28))
                (_Var3._M_t.
                 super__Tuple_impl<0UL,_google::protobuf::compiler::java::ImmutableFieldLiteGenerator_*,_std::default_delete<google::protobuf::compiler::java::ImmutableFieldLiteGenerator>_>
                 .
                 super__Head_base<0UL,_google::protobuf::compiler::java::ImmutableFieldLiteGenerator_*,_false>
                 ._M_head_impl,printer);
      lVar9 = lVar9 + 1;
      pDVar7 = this->descriptor_;
      lVar8 = lVar8 + 0x48;
    } while (lVar9 < *(int *)(pDVar7 + 4));
  }
  io::Printer::Print<char[10],std::__cxx11::string>
            (printer,"\n// @@protoc_insertion_point(builder_scope:$full_name$)\n",
             (char (*) [10])0x3fed9e,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             (*(long *)(pDVar7 + 8) + 0x20));
  io::Printer::Outdent(printer);
  io::Printer::Print<>(printer,"}\n");
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&vars._M_t);
  return;
}

Assistant:

void MessageBuilderLiteGenerator::Generate(io::Printer* printer) {
  WriteMessageDocComment(printer, descriptor_);
  printer->Print(
      "public static final class Builder extends\n"
      "    com.google.protobuf.GeneratedMessageLite.$extendible$Builder<\n"
      "      $classname$, Builder> implements\n"
      "    $extra_interfaces$\n"
      "    $classname$OrBuilder {\n",
      "classname", name_resolver_->GetImmutableClassName(descriptor_),
      "extra_interfaces", ExtraBuilderInterfaces(descriptor_), "extendible",
      descriptor_->extension_range_count() > 0 ? "Extendable" : "");
  printer->Indent();

  GenerateCommonBuilderMethods(printer);

  // oneof
  std::map<std::string, std::string> vars;
  for (auto oneof : oneofs_) {
    vars["oneof_name"] = context_->GetOneofGeneratorInfo(oneof)->name;
    vars["oneof_capitalized_name"] =
        context_->GetOneofGeneratorInfo(oneof)->capitalized_name;
    vars["oneof_index"] = StrCat(oneof->index());

    // oneofCase() and clearOneof()
    printer->Print(vars,
                   "@java.lang.Override\n"
                   "public $oneof_capitalized_name$Case\n"
                   "    get$oneof_capitalized_name$Case() {\n"
                   "  return instance.get$oneof_capitalized_name$Case();\n"
                   "}\n"
                   "\n"
                   "public Builder clear$oneof_capitalized_name$() {\n"
                   "  copyOnWrite();\n"
                   "  instance.clear$oneof_capitalized_name$();\n"
                   "  return this;\n"
                   "}\n"
                   "\n");
  }

  for (int i = 0; i < descriptor_->field_count(); i++) {
    printer->Print("\n");
    field_generators_.get(descriptor_->field(i))
        .GenerateBuilderMembers(printer);
  }

  printer->Print(
      "\n"
      "// @@protoc_insertion_point(builder_scope:$full_name$)\n",
      "full_name", descriptor_->full_name());

  printer->Outdent();
  printer->Print("}\n");
}